

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O1

Layer * setupLayer(Layer *l,mapfunc_t *map,int mc,int8_t zoom,int8_t edge,uint64_t saltbase,Layer *p
                  ,Layer *p2)

{
  long lVar1;
  
  l->getMap = map;
  l->mc = (int8_t)mc;
  l->zoom = zoom;
  l->edge = edge;
  l->scale = 0;
  if (1 < saltbase + 1) {
    lVar1 = (saltbase * 0x5851f42d4c957f2d + 0x14057b7ef7678150) * saltbase;
    lVar1 = (lVar1 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar1 + saltbase;
    saltbase = saltbase + (lVar1 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar1;
  }
  l->layerSalt = saltbase;
  l->startSalt = 0;
  l->startSeed = 0;
  l->noise = (void *)0x0;
  l->data = (void *)0x0;
  l->p = p;
  l->p2 = p2;
  return l;
}

Assistant:

Layer *setupLayer(Layer *l, mapfunc_t *map, int mc,
    int8_t zoom, int8_t edge, uint64_t saltbase, Layer *p, Layer *p2)
{
    //Layer *l = g->layers + layerId;
    l->getMap = map;
    l->mc = mc;
    l->zoom = zoom;
    l->edge = edge;
    l->scale = 0;
    if (saltbase == 0 || saltbase == LAYER_INIT_SHA)
        l->layerSalt = saltbase;
    else
        l->layerSalt = getLayerSalt(saltbase);
    l->startSalt = 0;
    l->startSeed = 0;
    l->noise = NULL;
    l->data = NULL;
    l->p = p;
    l->p2 = p2;
    return l;
}